

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

char fmt::v6::internal::decimal_point_impl<char>(locale_ref loc)

{
  char cVar1;
  numpunct *pnVar2;
  locale local_10 [8];
  
  if (loc.locale_ == (void *)0x0) {
    std::locale::locale(local_10);
  }
  else {
    std::locale::locale(local_10,(locale *)loc.locale_);
  }
  pnVar2 = std::use_facet<std::__cxx11::numpunct<char>>(local_10);
  cVar1 = (**(code **)(*(long *)pnVar2 + 0x10))(pnVar2);
  std::locale::~locale(local_10);
  return cVar1;
}

Assistant:

Locale locale_ref::get() const {
  static_assert(std::is_same<Locale, std::locale>::value, "");
  return locale_ ? *static_cast<const std::locale*>(locale_) : std::locale();
}